

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double eval_guided_crit_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *buffer_arr,
                 size_t *buffer_pos,bool as_relative_gain,double *saved_xmedian,double *split_point,
                 double *xmin,double *xmax,GainCriterion criterion,double min_gain,
                 MissingAction missing_action,size_t *cols_use,size_t ncols_use,bool force_cols_use,
                 double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 vector<double,_std::allocator<double>_> *w)

{
  double dVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  MissingAction MVar4;
  ulong uVar5;
  size_t sVar6;
  double *pdVar7;
  pointer pdVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  ulong __n;
  MissingAction missing_action_00;
  ulong *puVar14;
  size_t sVar15;
  size_t row;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  allocator_type local_71;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ignored;
  
  MVar4 = missing_action;
  pdVar7 = buffer_arr;
  local_68 = min_gain;
  todense<double,unsigned_long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  auVar3 = _DAT_0036e1f0;
  local_70 = (double)(end - st);
  __n = (long)local_70 + 1;
  if (__n == 0) {
    missing_action_00 = Fail;
    if (MVar4 != Impute) {
      missing_action_00 = MVar4;
    }
  }
  else {
    uVar5 = (ulong)local_70 & 0x1fffffffffffffff;
    sVar15 = (uVar5 - (SUB84(local_70,0) & 1)) + 2;
    auVar20._8_4_ = (int)uVar5;
    auVar20._0_8_ = uVar5;
    auVar20._12_4_ = (int)(uVar5 >> 0x20);
    sVar6 = 0;
    auVar20 = auVar20 ^ _DAT_0036e1f0;
    auVar19 = _DAT_0036e1e0;
    do {
      auVar18 = auVar19 ^ auVar3;
      iVar21 = auVar20._4_4_;
      iVar22 = auVar20._12_4_;
      if ((bool)(~(auVar18._4_4_ == iVar21 && auVar20._0_4_ < auVar18._0_4_ ||
                  iVar21 < auVar18._4_4_) & 1)) {
        buffer_pos[sVar6] = sVar6;
      }
      if ((auVar18._12_4_ != iVar22 || auVar18._8_4_ <= auVar20._8_4_) && auVar18._12_4_ <= iVar22)
      {
        buffer_pos[sVar6 + 1] = sVar6 + 1;
      }
      sVar6 = sVar6 + 2;
      lVar13 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar13 + 2;
    } while (sVar15 != sVar6);
    missing_action_00 = Fail;
    if (MVar4 != Impute) {
      missing_action_00 = MVar4;
    }
    if (MVar4 == Impute && __n != 0) {
      uVar5 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar7[uVar5])) {
          uVar5 = __n * 4 & 0xfffffffffffffff8;
          lVar13 = 0x3f;
          if (__n != 0) {
            for (; __n >> lVar13 == 0; lVar13 = lVar13 + -1) {
            }
          }
          std::
          __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,double*,unsigned_long*,unsigned_long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                    (buffer_pos,(unsigned_long *)((long)buffer_pos + uVar5),buffer_pos + __n,
                     (ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3503:30)>
                      )&buffer_arr);
          auVar3 = _DAT_0036e1f0;
          dVar1 = buffer_arr[*(long *)((long)buffer_pos + uVar5)];
          *saved_xmedian = dVar1;
          pdVar7 = buffer_arr;
          uVar10 = __n;
          if (((ulong)local_70 & 1) != 0) {
            puVar14 = buffer_pos;
            if (uVar5 != 8) {
              uVar11 = *buffer_pos;
              lVar13 = uVar5 - 8;
              puVar9 = buffer_pos;
              do {
                puVar9 = puVar9 + 1;
                uVar5 = *puVar9;
                bVar16 = uVar11 < uVar5;
                if (uVar11 <= uVar5) {
                  uVar11 = uVar5;
                }
                if (bVar16) {
                  puVar14 = puVar9;
                }
                lVar13 = lVar13 + -8;
              } while (lVar13 != 0);
            }
            dVar17 = ((double)CONCAT44(0x45300000,(int)(*puVar14 >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)*puVar14) - 4503599627370496.0);
            *saved_xmedian = (dVar1 - dVar17) * 0.5 + dVar17;
          }
          do {
            pdVar12 = saved_xmedian;
            if ((ulong)ABS(*pdVar7) < 0x7ff0000000000000) {
              pdVar12 = pdVar7;
            }
            *pdVar7 = *pdVar12;
            uVar10 = uVar10 - 1;
            pdVar7 = pdVar7 + 1;
          } while (uVar10 != 0);
          sVar6 = 0;
          auVar18 = _DAT_0036e1e0;
          do {
            auVar19 = auVar18 ^ auVar3;
            if ((bool)(~(auVar19._4_4_ == iVar21 && auVar20._0_4_ < auVar19._0_4_ ||
                        iVar21 < auVar19._4_4_) & 1)) {
              buffer_pos[sVar6] = sVar6;
            }
            if ((auVar19._12_4_ != iVar22 || auVar19._8_4_ <= auVar20._8_4_) &&
                auVar19._12_4_ <= iVar22) {
              buffer_pos[sVar6 + 1] = sVar6 + 1;
            }
            sVar6 = sVar6 + 2;
            lVar13 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar13 + 2;
            missing_action_00 = Fail;
          } while (sVar15 != sVar6);
          goto LAB_0022643d;
        }
        uVar5 = uVar5 + 1;
      } while (__n != uVar5);
      missing_action_00 = Fail;
    }
  }
LAB_0022643d:
  std::vector<double,_std::allocator<double>_>::vector(&buffer_w,__n,&local_71);
  if (st <= end) {
    pdVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pdVar8 = pdVar2[ix_arr[st]];
      st = st + 1;
      pdVar8 = pdVar8 + 1;
    } while (st <= end);
  }
  local_70 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                       (buffer_pos,0,(size_t)local_70,buffer_arr,buffer_arr + __n,as_relative_gain,
                        saved_xmedian,(double *)0x0,&ignored,split_point,xmin,xmax,criterion,
                        local_68,missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,
                        ncols,Xr,Xr_ind,Xr_indptr,&buffer_w);
  if (buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_70;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}